

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O2

Maybe<capnp::MessageReaderAndFds> * __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:236:23)>
::anon_class_32_2_fe89d4e7_for_func::operator()
          (Maybe<capnp::MessageReaderAndFds> *__return_storage_ptr__,
          anon_class_32_2_fe89d4e7_for_func *this,Maybe<unsigned_long> *nfds)

{
  AsyncMessageReader *pAVar1;
  Own<capnp::MessageReader,_std::nullptr_t> local_28;
  OwnFd *local_18;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_10;
  
  if ((nfds->ptr).isSet == true) {
    local_28.disposer = (this->reader).disposer;
    pAVar1 = (this->reader).ptr;
    local_18 = (this->fdSpace).ptr;
    (this->reader).ptr = (AsyncMessageReader *)0x0;
    local_10 = (nfds->ptr).field_1;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.reader.disposer = local_28.disposer;
    (__return_storage_ptr__->ptr).field_1.value.reader.ptr = &pAVar1->super_MessageReader;
    local_28.ptr = (MessageReader *)0x0;
    (__return_storage_ptr__->ptr).field_1.value.fds.ptr = local_18;
    (__return_storage_ptr__->ptr).field_1.value.fds.size_ = (size_t)local_10;
    Own<capnp::MessageReader,_std::nullptr_t>::dispose(&local_28);
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  return __return_storage_ptr__;
}

Assistant:

KJ_IF_SOME(n, nfds) {
      return MessageReaderAndFds { kj::mv(reader), fdSpace.first(n) };
    }